

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

void spvc_msl_sampler_ycbcr_conversion_init(spvc_msl_sampler_ycbcr_conversion *conv)

{
  int i;
  long lVar1;
  MSLConstexprSampler defaults;
  MSLConstexprSampler local_74;
  
  spirv_cross::MSLConstexprSampler::MSLConstexprSampler(&local_74);
  conv->planes = local_74.planes;
  conv->resolution = local_74.resolution;
  conv->chroma_filter = local_74.chroma_filter;
  conv->x_chroma_offset = local_74.x_chroma_offset;
  conv->y_chroma_offset = local_74.y_chroma_offset;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    conv->swizzle[lVar1] = local_74.swizzle[lVar1];
  }
  conv->ycbcr_model = local_74.ycbcr_model;
  conv->ycbcr_range = local_74.ycbcr_range;
  return;
}

Assistant:

void spvc_msl_sampler_ycbcr_conversion_init(spvc_msl_sampler_ycbcr_conversion *conv)
{
#if SPIRV_CROSS_C_API_MSL
	MSLConstexprSampler defaults;
	conv->planes = defaults.planes;
	conv->resolution = static_cast<spvc_msl_format_resolution>(defaults.resolution);
	conv->chroma_filter = static_cast<spvc_msl_sampler_filter>(defaults.chroma_filter);
	conv->x_chroma_offset = static_cast<spvc_msl_chroma_location>(defaults.x_chroma_offset);
	conv->y_chroma_offset = static_cast<spvc_msl_chroma_location>(defaults.y_chroma_offset);
	for (int i = 0; i < 4; i++)
		conv->swizzle[i] = static_cast<spvc_msl_component_swizzle>(defaults.swizzle[i]);
	conv->ycbcr_model = static_cast<spvc_msl_sampler_ycbcr_model_conversion>(defaults.ycbcr_model);
	conv->ycbcr_range = static_cast<spvc_msl_sampler_ycbcr_range>(defaults.ycbcr_range);
#else
	memset(conv, 0, sizeof(*conv));
#endif
}